

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::
ASTVisitor<always_ff_assignment_outside_conditional::MainVisitor,_true,_true,_false,_false>::
visit<slang::ast::HierarchicalValueExpression>
          (ASTVisitor<always_ff_assignment_outside_conditional::MainVisitor,_true,_true,_false,_false>
           *this,HierarchicalValueExpression *t)

{
  bool bVar1;
  HierarchicalValueExpression *in_RSI;
  ASTVisitor<always_ff_assignment_outside_conditional::MainVisitor,_true,_true,_false,_false>
  *in_RDI;
  
  bVar1 = Expression::bad((Expression *)in_RSI);
  if (!bVar1) {
    visitDefault<slang::ast::HierarchicalValueExpression>(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }